

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::hyperChooseColumn(HEkkPrimal *this)

{
  double dVar1;
  int iVar2;
  int entry;
  HEkk *pHVar3;
  bool bVar4;
  char *__format;
  long lVar5;
  double dVar6;
  double local_58;
  
  if ((this->use_hyper_chuzc != true) || (this->initialise_hyper_chuzc != false)) {
    return;
  }
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2d,0);
  pHVar3 = this->ekk_instance_;
  if (this->report_hyper_chuzc == true) {
    printf("H-S  CHUZC: Max changed measure is %9.4g for column %4d",this->max_changed_measure_value
           ,(ulong)(uint)this->max_changed_measure_column);
  }
  local_58 = this->max_changed_measure_value;
  this->variable_in = -1;
  iVar2 = this->max_changed_measure_column;
  if ((-1 < (long)iVar2) &&
     ((dVar6 = (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start[iVar2], dVar6 != 0.0 || (NAN(dVar6))))) {
    this->variable_in = iVar2;
  }
  if (0 < this->num_hyper_chuzc_candidates) {
    iVar2 = (this->nonbasic_free_col_set).count_;
    lVar5 = 0;
    do {
      entry = (this->hyper_chuzc_candidate).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5 + 1];
      if ((pHVar3->basis_).nonbasicFlag_.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[entry] != '\0') {
        dVar6 = (double)-(int)(pHVar3->basis_).nonbasicMove_.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start[entry] *
                (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[entry];
        if (iVar2 != 0) {
          bVar4 = HSet::in(&this->nonbasic_free_col_set,entry);
          if (bVar4) {
            dVar6 = ABS((pHVar3->info_).workDual_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[entry]);
          }
        }
        if (this->dual_feasibility_tolerance <= dVar6 && dVar6 != this->dual_feasibility_tolerance)
        {
          dVar1 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[entry];
          if (local_58 * dVar1 < dVar6 * dVar6) {
            local_58 = (dVar6 * dVar6) / dVar1;
            this->variable_in = entry;
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->num_hyper_chuzc_candidates);
  }
  if (this->variable_in != this->max_changed_measure_column) {
    if (this->report_hyper_chuzc == true) {
      printf(", and after HS CHUZC set it is now %9.4g for column %4d",local_58);
    }
    dVar6 = this->max_hyper_chuzc_non_candidate_measure;
    if (this->max_hyper_chuzc_non_candidate_measure <= this->max_changed_measure_value) {
      dVar6 = this->max_changed_measure_value;
    }
    this->max_hyper_chuzc_non_candidate_measure = dVar6;
  }
  if (this->max_hyper_chuzc_non_candidate_measure <= local_58) {
    this->done_next_chuzc = true;
    if (this->report_hyper_chuzc == false) goto LAB_00361bc2;
    __format = ", and no       has  measure >  %9.4g\n";
  }
  else {
    this->initialise_hyper_chuzc = true;
    this->done_next_chuzc = false;
    if (this->report_hyper_chuzc != true) goto LAB_00361bc2;
    __format = ", but some may have measure >= %9.4g\n";
  }
  printf(__format);
LAB_00361bc2:
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2d,0);
  return;
}

Assistant:

void HEkkPrimal::hyperChooseColumn() {
  if (!use_hyper_chuzc) return;
  if (initialise_hyper_chuzc) return;
  analysis->simplexTimerStart(ChuzcHyperClock);
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  const vector<int8_t>& nonbasicFlag = ekk_instance_.basis_.nonbasicFlag_;
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  if (report_hyper_chuzc)
    printf(
        "H-S  CHUZC: Max changed measure is %9.4g for column %4" HIGHSINT_FORMAT
        "",
        max_changed_measure_value, max_changed_measure_column);
  double best_measure = max_changed_measure_value;
  variable_in = -1;
  if (max_changed_measure_column >= 0) {
    // Use max_changed_measure_column if it is well defined and has
    // nonzero dual. It may have been zeroed because it is taboo
    if (workDual[max_changed_measure_column])
      variable_in = max_changed_measure_column;
  }
  const bool consider_nonbasic_free_column =
      (nonbasic_free_col_set.count() != 0);
  if (num_hyper_chuzc_candidates) {
    for (HighsInt iEntry = 1; iEntry <= num_hyper_chuzc_candidates; iEntry++) {
      HighsInt iCol = hyper_chuzc_candidate[iEntry];
      if (nonbasicFlag[iCol] == kNonbasicFlagFalse) {
        assert(!nonbasicMove[iCol]);
        continue;
      }
      // Assess any dual infeasibility
      double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
      if (consider_nonbasic_free_column) {
        if (nonbasic_free_col_set.in(iCol))
          dual_infeasibility = fabs(workDual[iCol]);
      }
      if (dual_infeasibility > dual_feasibility_tolerance) {
        if (dual_infeasibility * dual_infeasibility >
            best_measure * edge_weight_[iCol]) {
          best_measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
          variable_in = iCol;
        }
      }
    }
  }
  if (variable_in != max_changed_measure_column) {
    if (report_hyper_chuzc)
      printf(
          ", and after HS CHUZC set it is now %9.4g for column "
          "%4" HIGHSINT_FORMAT "",
          best_measure, variable_in);
    max_hyper_chuzc_non_candidate_measure =
        max(max_changed_measure_value, max_hyper_chuzc_non_candidate_measure);
  }
  if (best_measure >= max_hyper_chuzc_non_candidate_measure) {
    // Candidate is at least as good as any unknown column, so accept it
    done_next_chuzc = true;
    if (report_hyper_chuzc)
      printf(", and no       has  measure >  %9.4g\n",
             max_hyper_chuzc_non_candidate_measure);
  } else {
    // Candidate isn't as good as best unknown column, so do a full CHUZC
    // Shouldn't claim to have done the next CHUZC
    assert(!done_next_chuzc);
    done_next_chuzc = false;
    initialise_hyper_chuzc = true;
    if (report_hyper_chuzc)
      printf(", but some may have measure >= %9.4g\n",
             max_hyper_chuzc_non_candidate_measure);
  }
  analysis->simplexTimerStop(ChuzcHyperClock);
}